

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceWholeDebugDeclare
          (ScalarReplacementPass *this,Instruction *dbg_decl,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  IRContext *pIVar1;
  DefUseManager *this_00;
  DebugInfoManager *this_01;
  pointer pOVar2;
  uint32_t uVar3;
  Instruction *pIVar4;
  Instruction *pIVar5;
  bool bVar6;
  Instruction *insert_before;
  int val;
  pointer ppIVar7;
  undefined **local_a0;
  undefined1 local_98 [24];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_80;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_78;
  Instruction *local_70;
  Instruction *local_68;
  pointer local_60;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  local_70 = dbg_decl;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  this_00 = (pIVar1->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar3 = Instruction::GetSingleWordOperand(local_70,6);
  pIVar4 = analysis::DefUseManager::GetDef(this_00,uVar3);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar1->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
    IRContext::BuildDebugInfoManager(pIVar1);
  }
  local_68 = analysis::DebugInfoManager::DerefDebugExpression
                       ((pIVar1->debug_info_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                        _M_head_impl,pIVar4);
  ppIVar7 = (replacements->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (replacements->
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar7 == local_60) {
    bVar6 = true;
  }
  else {
    val = 0;
    do {
      pIVar4 = *ppIVar7;
      insert_before = (pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      while( true ) {
        pIVar5 = (Instruction *)0x0;
        if ((insert_before->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ ==
            false) {
          pIVar5 = insert_before;
        }
        if (pIVar5->opcode_ != OpVariable) break;
        insert_before =
             (insert_before->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      }
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar1->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
        IRContext::BuildDebugInfoManager(pIVar1);
      }
      this_01 = (pIVar1->debug_info_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                _M_head_impl;
      uVar3 = 0;
      if (pIVar4->has_result_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand(pIVar4,(uint)pIVar4->has_type_id_);
      }
      pIVar4 = analysis::DebugInfoManager::AddDebugValueForDecl
                         (this_01,local_70,uVar3,insert_before,local_70);
      bVar6 = pIVar4 != (Instruction *)0x0;
      if (pIVar4 == (Instruction *)0x0) {
        return bVar6;
      }
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
        IRContext::BuildConstantManager(pIVar1);
      }
      local_58._16_4_ =
           analysis::ConstantManager::GetSIntConstId
                     ((pIVar1->constant_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                      _M_head_impl,val);
      local_58._0_8_ = &PTR__SmallVector_003d7c78;
      local_58._24_8_ = local_58 + 0x10;
      local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_58._8_8_ = 1;
      local_a0 = (undefined **)CONCAT44(local_a0._4_4_,SPV_OPERAND_TYPE_ID);
      local_98._0_8_ = &PTR__SmallVector_003d7c78;
      local_98._8_8_ = 0;
      local_80 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_98 + 0x10);
      local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)local_98,
                 (SmallVector<unsigned_int,_2UL> *)local_58);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&pIVar4->operands_,(Operand *)&local_a0);
      local_98._0_8_ = &PTR__SmallVector_003d7c78;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_78._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_78,local_78._M_head_impl);
      }
      local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_58._0_8_ = &PTR__SmallVector_003d7c78;
      if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_38,local_38._M_head_impl);
      }
      uVar3 = 0;
      if (local_68->has_result_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand(local_68,(uint)local_68->has_type_id_);
      }
      local_a0 = &PTR__SmallVector_003d7c78;
      local_98._16_8_ = (long)local_98 + 8;
      local_80 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_98._8_4_ = uVar3;
      local_98._0_8_ = (_func_int **)0x1;
      pOVar2 = (pIVar4->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(pIVar4->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
                 -0x5555555555555555) < 7) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2b8,
                      "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                     );
      }
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&pOVar2[6].words,(SmallVector<unsigned_int,_2UL> *)&local_a0);
      local_a0 = &PTR__SmallVector_003d7c78;
      if (local_80 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_80,local_80);
      }
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        analysis::DefUseManager::AnalyzeInstUse
                  ((pIVar1->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,pIVar4);
      }
      val = val + 1;
      ppIVar7 = ppIVar7 + 1;
    } while (ppIVar7 != local_60);
  }
  return bVar6;
}

Assistant:

bool ScalarReplacementPass::ReplaceWholeDebugDeclare(
    Instruction* dbg_decl, const std::vector<Instruction*>& replacements) {
  // Insert Deref operation to the front of the operation list of |dbg_decl|.
  Instruction* dbg_expr = context()->get_def_use_mgr()->GetDef(
      dbg_decl->GetSingleWordOperand(kDebugValueOperandExpressionIndex));
  auto* deref_expr =
      context()->get_debug_info_mgr()->DerefDebugExpression(dbg_expr);

  // Add DebugValue instruction with Indexes operand and Deref operation.
  int32_t idx = 0;
  for (const auto* var : replacements) {
    Instruction* insert_before = var->NextNode();
    while (insert_before->opcode() == spv::Op::OpVariable)
      insert_before = insert_before->NextNode();
    assert(insert_before != nullptr && "unexpected end of list");
    Instruction* added_dbg_value =
        context()->get_debug_info_mgr()->AddDebugValueForDecl(
            dbg_decl, /*value_id=*/var->result_id(),
            /*insert_before=*/insert_before, /*scope_and_line=*/dbg_decl);

    if (added_dbg_value == nullptr) return false;
    added_dbg_value->AddOperand(
        {SPV_OPERAND_TYPE_ID,
         {context()->get_constant_mgr()->GetSIntConstId(idx)}});
    added_dbg_value->SetOperand(kDebugValueOperandExpressionIndex,
                                {deref_expr->result_id()});
    if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse)) {
      context()->get_def_use_mgr()->AnalyzeInstUse(added_dbg_value);
    }
    ++idx;
  }
  return true;
}